

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O0

double point_distance_1d_pdf(double x,int a,double b)

{
  __type _Var1;
  __type _Var2;
  double dVar3;
  double local_28;
  double pdf;
  double b_local;
  int a_local;
  double x_local;
  
  if (a < 1) {
    std::operator<<((ostream *)&std::cerr," \n");
    std::operator<<((ostream *)&std::cerr,"POINT_DISTANCE_1D_PDF - Fatal error!\n");
    std::operator<<((ostream *)&std::cerr,"  Input parameter A < 1.\n");
    exit(1);
  }
  if (b <= 0.0) {
    std::operator<<((ostream *)&std::cerr," \n");
    std::operator<<((ostream *)&std::cerr,"POINT_DISTANCE_1D_PDF - Fatal error!\n");
    std::operator<<((ostream *)&std::cerr,"  Input parameter B <= 0.0.\n");
    exit(1);
  }
  if (0.0 <= x) {
    _Var1 = std::pow<double,int>(b,a);
    _Var2 = std::pow<double,int>(x,a + -1);
    dVar3 = exp(-b * x);
    local_28 = r8_factorial(a + -1);
    local_28 = (_Var1 * _Var2 * dVar3) / local_28;
  }
  else {
    local_28 = 0.0;
  }
  return local_28;
}

Assistant:

double point_distance_1d_pdf ( double x, int a, double b )

//****************************************************************************80
//
//  Purpose:
//
//    POINT_DISTANCE_1D_PDF evaluates the point distance PDF in 1D.
//
//  Discussion:
//
//    It is assumed that a set of points has been generated in 1D
//    according to a Poisson process.  The number of points in a region
//    of size LENGTH is a Poisson variate with mean value B * LENGTH.
//
//    For a point chosen at random, we may now find the nearest
//    Poisson point, the second nearest and so on.  We are interested
//    in the PDF that governs the expected behavior of the distances
//    of rank A = 1, 2, 3, ... with Poisson density B.
//
//    Note that this PDF is a form of the Gamma PDF.???
//
//    PDF(A,B;X) = B^A * X^( A - 1 ) * EXP ( - B * X ) / ( A - 1 )!
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    17 October 2004
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, double X, the argument of the PDF.
//    0.0 <= X.
//
//    Input, int A, indicates the degree of nearness of the point.
//    A = 1 means the nearest point, A = 2 the second nearest, and so on.
//    0 < A.
//
//    Input, double B, the point density.  0.0 < B.
//
//    Output, double PDF, the value of the PDF.
//
{
  double pdf;

  if ( a < 1 )
  {
    cerr << " \n";
    cerr << "POINT_DISTANCE_1D_PDF - Fatal error!\n";
    cerr << "  Input parameter A < 1.\n";
    exit ( 1 );
  }

  if ( b <= 0.0 )
  {
    cerr << " \n";
    cerr << "POINT_DISTANCE_1D_PDF - Fatal error!\n";
    cerr << "  Input parameter B <= 0.0.\n";
    exit ( 1 );
  }

  if ( x < 0.0 )
  {
    pdf = 0.0;
  }
  else
  {
    pdf = pow ( b, a ) * pow ( x, a - 1 ) * exp ( - b * x ) / r8_factorial ( a - 1 );
  }

  return pdf;
}